

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O2

void __thiscall
duckdb::StringStatisticsState::StringStatisticsState(StringStatisticsState *this,LogicalTypeId type)

{
  (this->super_ColumnWriterStatistics)._vptr_ColumnWriterStatistics =
       (_func_int **)&PTR__StringStatisticsState_027d3bb0;
  this->type = type;
  this->has_stats = false;
  this->min_truncated = false;
  this->max_truncated = false;
  this->failed_truncate = false;
  (this->min)._M_dataplus._M_p = (pointer)&(this->min).field_2;
  (this->min)._M_string_length = 0;
  (this->min).field_2._M_local_buf[0] = '\0';
  (this->max)._M_dataplus._M_p = (pointer)&(this->max).field_2;
  (this->max)._M_string_length = 0;
  (this->max).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit StringStatisticsState(LogicalTypeId type = LogicalTypeId::VARCHAR)
	    : type(type), has_stats(false), min_truncated(false), max_truncated(false), min(), max() {
	}